

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O0

value * __thiscall
mjs::string_object::internal_value(value *__return_storage_ptr__,string_object *this)

{
  undefined1 local_28 [24];
  string_object *this_local;
  
  local_28._16_8_ = this;
  this_local = (string_object *)__return_storage_ptr__;
  string_value((string_object *)local_28);
  value::value(__return_storage_ptr__,(string *)local_28);
  string::~string((string *)local_28);
  return __return_storage_ptr__;
}

Assistant:

value internal_value() const override {
        return value{string_value()};
    }